

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O3

void ut::
     are_equal<agge::tests::mocks::coords_pair<float>,2ul,std::vector<agge::tests::mocks::coords_pair<float>,std::allocator<agge::tests::mocks::coords_pair<float>>>>
               (coords_pair<float> (*expected) [2],
               vector<agge::tests::mocks::coords_pair<float>,_std::allocator<agge::tests::mocks::coords_pair<float>_>_>
               *actual,LocationInfo *location)

{
  pointer pcVar1;
  bool bVar2;
  FailedAssertion *pFVar3;
  long lVar4;
  string local_48;
  
  pcVar1 = (actual->
           super__Vector_base<agge::tests::mocks::coords_pair<float>,_std::allocator<agge::tests::mocks::coords_pair<float>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(actual->
            super__Vector_base<agge::tests::mocks::coords_pair<float>,_std::allocator<agge::tests::mocks::coords_pair<float>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 != 0x20) {
    pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Values are not equal!","");
    FailedAssertion::FailedAssertion(pFVar3,&local_48,location);
    __cxa_throw(pFVar3,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  lVar4 = 0;
  do {
    bVar2 = agge::tests::mocks::coords_pair<float>::operator==
                      ((coords_pair<float> *)((long)&(*expected)[0].x1 + lVar4),
                       (coords_pair<float> *)((long)&pcVar1->x1 + lVar4));
    if (!bVar2) {
      pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Value is not \'true\'!","");
      FailedAssertion::FailedAssertion(pFVar3,&local_48,location);
      __cxa_throw(pFVar3,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x20);
  return;
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}